

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmClassPrototype(LlvmCompilationContext *ctx,ExprClassPrototype *node)

{
  if ((node->super_ExprBase).type == ctx->ctx->typeVoid) {
    return (LLVMValueRef)0x0;
  }
  __assert_fail("node->type == ctx.ctx.typeVoid",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x27b,"LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)")
  ;
}

Assistant:

LLVMValueRef CheckType(LlvmCompilationContext &ctx, ExprBase *node, LLVMValueRef value)
{
	if(!value)
	{
		assert(node->type == ctx.ctx.typeVoid);

		return NULL;
	}

	LLVMTypeRef valueType = LLVMTypeOf(value);
	LLVMTypeRef expectedType = CompileLlvmType(ctx, GetStackType(ctx, node->type));

	if(valueType != expectedType)
	{
		printf("Wrong result type\nExpected: ");
		LLVMDumpType(expectedType);
		printf("\n     Got: ");
		LLVMDumpType(valueType);
		printf("\n");

		assert(!"wrong result type");
	}

	return value;
}